

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  _func_void_uv__work_ptr *p_Var11;
  ssize_t sVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *__buf;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  iovec *iov;
  code *pcVar18;
  _func_void_uv__work_ptr_int *p_Var19;
  _func_void_uv__work_ptr_int *p_Var20;
  size_t sVar21;
  size_t __nbytes;
  long lVar22;
  double dVar23;
  _func_void_uv__work_ptr_int *p_StackY_2120;
  int local_2110;
  _func_void_uv__work_ptr_int *local_2108;
  _func_void_uv__work_ptr_int *local_20d0;
  pollfd pfd;
  __mode_t local_20b0;
  size_t local_2098;
  stat pbuf;
  
  iVar1 = *(int *)&w[-7].done;
  puVar10 = (uint *)__errno_location();
  do {
    *puVar10 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      if (uv__fs_open_no_cloexec_support != '\0') {
LAB_003f7592:
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar7 = open((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1))
        ;
        if ((-1 < iVar7) && (iVar8 = uv__cloexec_ioctl(iVar7,1), iVar8 != 0)) {
          iVar7 = uv__close(iVar7);
          if (iVar7 != 0) {
switchD_003f7555_default:
            abort();
          }
          iVar7 = -1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
        goto LAB_003f7e1d;
      }
      uVar9 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
      if ((int)uVar9 < 0) {
        if (*puVar10 != 0x16) break;
        uv__fs_open_no_cloexec_support = '\x01';
        goto LAB_003f7592;
      }
      p_StackY_2120 = (_func_void_uv__work_ptr_int *)(ulong)uVar9;
      goto LAB_003f809c;
    case 2:
      uVar9 = close(*(int *)w[-2].wq);
      break;
    case 3:
      uVar6 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      if (uVar6 < uVar9) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar6;
        uVar9 = uVar6;
      }
      p_Var20 = w[-1].done;
      if ((long)p_Var20 < 0) {
        piVar2 = (iovec *)w[-1].work;
        if (uVar9 == 1) {
          p_StackY_2120 =
               (_func_void_uv__work_ptr_int *)
               read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
        }
        else {
          p_StackY_2120 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar9);
        }
      }
      else if ((uVar9 == 1) || (uv__fs_read_no_preadv == '\x01')) {
LAB_003f79a4:
        p_StackY_2120 =
             (_func_void_uv__work_ptr_int *)
             pread(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                   (__off_t)p_Var20);
      }
      else {
        p_StackY_2120 =
             (_func_void_uv__work_ptr_int *)
             uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar9,(int64_t)p_Var20);
        if (p_StackY_2120 == (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
          if (*puVar10 == 0x26) {
            uv__fs_read_no_preadv = '\x01';
            p_Var20 = w[-1].done;
            goto LAB_003f79a4;
          }
          p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_003f7e27;
    case 4:
      uVar6 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      p_Var20 = (_func_void_uv__work_ptr_int *)0x0;
LAB_003f79e0:
      if (uVar9 != 0) {
        uVar17 = uVar6;
        if (uVar9 < uVar6) {
          uVar17 = uVar9;
        }
        *(uint *)((long)w[-2].wq + 0xc) = uVar17;
        do {
          p_Var19 = w[-1].done;
          if ((long)p_Var19 < 0) {
            piVar2 = (iovec *)w[-1].work;
            if (uVar17 == 1) {
              p_StackY_2120 =
                   (_func_void_uv__work_ptr_int *)
                   write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
            }
            else {
              p_StackY_2120 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar17);
            }
LAB_003f7a56:
            if (-1 < (long)p_StackY_2120) goto LAB_003f7a8a;
            uVar17 = *puVar10;
          }
          else {
            iov = (iovec *)w[-1].work;
            if ((uVar17 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_003f7a10:
              p_StackY_2120 =
                   (_func_void_uv__work_ptr_int *)
                   pwrite(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off_t)p_Var19);
              goto LAB_003f7a56;
            }
            p_StackY_2120 =
                 (_func_void_uv__work_ptr_int *)
                 uv__pwritev(*(int *)w[-2].wq,iov,uVar17,(int64_t)p_Var19);
            if (p_StackY_2120 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff)
            goto LAB_003f7a56;
            uVar17 = *puVar10;
            if (uVar17 == 0x26) {
              uv__fs_write_no_pwritev = '\x01';
              iov = (iovec *)w[-1].work;
              p_Var19 = w[-1].done;
              goto LAB_003f7a10;
            }
            p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          }
          if (uVar17 != 4) goto LAB_003f801c;
          uVar17 = *(uint *)((long)w[-2].wq + 0xc);
        } while( true );
      }
LAB_003f8023:
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      p_StackY_2120 = p_Var20;
      goto LAB_003f7e27;
    case 5:
      local_20d0 = w[-1].done;
      sVar12 = sendfile(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(off_t *)&local_20d0,
                        (size_t)w[1].done);
      local_2108 = w[-1].done;
      p_StackY_2120 = local_20d0 + -(long)local_2108;
      p_Var20 = local_20d0;
      if ((p_StackY_2120 == (_func_void_uv__work_ptr_int *)0x0 ||
          (long)local_20d0 < (long)local_2108) && sVar12 == -1) {
        uVar9 = *puVar10;
        if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) || (uVar9 == 0x58)) {
          *puVar10 = 0;
          p_Var19 = w[1].done;
          iVar7 = *(int *)w[-2].wq;
          iVar8 = *(int *)((long)w[-2].wq + 4);
          bVar4 = true;
          p_StackY_2120 = (_func_void_uv__work_ptr_int *)0x0;
LAB_003f76e0:
          do {
            uVar16 = (long)p_Var19 - (long)p_StackY_2120;
            p_Var20 = local_2108;
            if (p_Var19 < p_StackY_2120 || uVar16 == 0) {
LAB_003f7f6f:
              if (p_StackY_2120 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff)
              goto LAB_003f7f8a;
              break;
            }
            __nbytes = 0x2000;
            if (uVar16 < 0x2000) {
              __nbytes = uVar16;
            }
            do {
              if (bVar4) {
                lVar22 = pread(iVar8,&pbuf,__nbytes,(__off_t)local_2108);
              }
              else {
                lVar22 = read(iVar8,&pbuf,__nbytes);
              }
              if (lVar22 != -1) {
                if (lVar22 == 0) goto LAB_003f7f6f;
                lVar15 = 0;
                goto LAB_003f7781;
              }
              uVar9 = *puVar10;
            } while (uVar9 == 4);
            if ((p_StackY_2120 != (_func_void_uv__work_ptr_int *)0x0) || (!bVar4)) {
              if ((code *)0x1 < p_StackY_2120 + 1) goto LAB_003f7f8a;
              break;
            }
            p_StackY_2120 = (_func_void_uv__work_ptr_int *)0x0;
            bVar4 = false;
          } while ((uVar9 == 5) || (uVar9 == 0x1d));
        }
        p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
LAB_003f7f8a:
        w[-1].done = p_Var20;
      }
      goto LAB_003f7e27;
    case 6:
      iVar7 = stat((char *)w[-6].done,(stat *)&pbuf);
      goto LAB_003f7bbe;
    case 7:
      iVar7 = lstat((char *)w[-6].done,(stat *)&pbuf);
      goto LAB_003f7bbe;
    case 8:
      iVar7 = fstat(*(int *)w[-2].wq,(stat *)&pbuf);
LAB_003f7bbe:
      if (iVar7 == 0) {
        uv__to_stat(&pbuf,(uv_stat_t *)&w[-6].loop);
      }
LAB_003f7e1d:
      p_StackY_2120 = (_func_void_uv__work_ptr_int *)(long)iVar7;
      goto LAB_003f7e27;
    case 9:
      uVar9 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
      break;
    case 10:
      pbuf.st_dev = (__dev_t)(double)w[-1].wq[0];
      dVar23 = (double)w[-1].wq[0] * 1000000.0;
      uVar16 = (ulong)dVar23;
      pbuf.st_ino = (((long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      pbuf.st_nlink = (__nlink_t)(double)w[-1].wq[1];
      dVar23 = (double)w[-1].wq[1] * 1000000.0;
      uVar16 = (ulong)dVar23;
      pbuf._24_8_ = (((long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      uVar9 = utimensat(-100,(char *)w[-6].done,(timespec *)&pbuf,0);
      break;
    case 0xb:
      pbuf.st_dev = (__dev_t)(double)w[-1].wq[0];
      dVar23 = (double)w[-1].wq[0] * 1000000.0;
      uVar16 = (ulong)dVar23;
      pbuf.st_ino = (((long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      pbuf.st_nlink = (__nlink_t)(double)w[-1].wq[1];
      dVar23 = (double)w[-1].wq[1] * 1000000.0;
      uVar16 = (ulong)dVar23;
      pbuf._24_8_ = (((long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      uVar9 = futimens(*(int *)w[-2].wq,(timespec *)&pbuf);
      break;
    case 0xc:
      uVar9 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      uVar9 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      uVar9 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      uVar9 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      uVar9 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      uVar9 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      uVar9 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      uVar9 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar14 = mkdtemp((char *)w[-6].done);
      p_StackY_2120 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar14 == (char *)0x0);
      goto LAB_003f7e27;
    case 0x15:
      uVar9 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      pbuf.st_dev = 0;
      iVar7 = scandir((char *)w[-6].done,(dirent ***)&pbuf,uv__fs_scandir_filter,uv__fs_scandir_sort
                     );
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar7 != -1) {
        p_Var11 = (_func_void_uv__work_ptr *)pbuf.st_dev;
        if (iVar7 == 0) {
          free((void *)pbuf.st_dev);
          p_Var11 = (_func_void_uv__work_ptr *)0x0;
        }
        w[-6].work = p_Var11;
        goto LAB_003f7e1d;
      }
      p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_003f7e27;
    case 0x17:
      uVar9 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      uVar9 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar13 = pathconf((char *)w[-6].done,4);
      sVar21 = 0x100;
      if (sVar13 != 0xffffffffffffffff) {
        sVar21 = sVar13;
      }
      __buf = (_func_void_uv__work_ptr *)uv__malloc(sVar21);
      if (__buf == (_func_void_uv__work_ptr *)0x0) {
        *puVar10 = 0xc;
      }
      else {
        sVar13 = readlink((char *)w[-6].done,(char *)__buf,sVar21);
        if ((sVar13 != 0xffffffffffffffff) &&
           ((p_Var11 = __buf, sVar13 != sVar21 ||
            (p_Var11 = (_func_void_uv__work_ptr *)uv__realloc(__buf,sVar21 + 1), sVar13 = sVar21,
            p_Var11 != (_func_void_uv__work_ptr *)0x0)))) {
          p_Var11[sVar13] = (_func_void_uv__work_ptr)0x0;
          goto LAB_003f80e1;
        }
        uv__free(__buf);
      }
      goto LAB_003f7e31;
    case 0x1a:
      uVar9 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      uVar9 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var11 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var11 != (_func_void_uv__work_ptr *)0x0) {
LAB_003f80e1:
        w[-6].work = p_Var11;
        w[-7].wq[1] = (void *)0x0;
        goto LAB_003f80a8;
      }
      goto LAB_003f7e31;
    case 0x1d:
      iVar7 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&pbuf,(char *)w[-6].done,0,0,(uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&pbuf);
      if (iVar7 < 0) {
        p_StackY_2120 = (_func_void_uv__work_ptr_int *)(long)iVar7;
      }
      else {
        iVar8 = fstat(iVar7,(stat *)&pfd);
        if (iVar8 == 0) {
          local_2110 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&pbuf,(char *)w[-2].loop,
                                  (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_20b0,
                                  (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&pbuf);
          iVar8 = local_2110;
          if (-1 < local_2110) {
            iVar8 = fchmod(local_2110,local_20b0);
            if (iVar8 == -1) goto LAB_003f7d3d;
            if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_003f7ef3:
              lVar22 = 0;
              for (sVar21 = local_2098; sVar21 != 0; sVar21 = sVar21 - pbuf.st_mtim.tv_sec) {
                iVar8 = uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)&pbuf,local_2110,iVar7,lVar22,
                                       sVar21,(uv_fs_cb)0x0);
                uv_fs_req_cleanup((uv_fs_t *)&pbuf);
                if (iVar8 < 0) goto LAB_003f7d4d;
                lVar22 = lVar22 + pbuf.st_mtim.tv_sec;
              }
            }
            else {
              iVar8 = ioctl(local_2110,0x40049409,iVar7);
              if (iVar8 == -1) {
                uVar9 = *puVar10;
                if (((uVar9 == 0x12) || (uVar9 == 0x5f)) || (uVar9 == 0x19)) {
                  if (((ulong)w[-2].wq[0] & 0x400000000) != 0) {
                    iVar8 = -0x5f;
                    goto LAB_003f7d4d;
                  }
                  goto LAB_003f7ef3;
                }
                goto LAB_003f7d40;
              }
            }
            iVar8 = 0;
          }
        }
        else {
          local_2110 = -1;
LAB_003f7d3d:
          uVar9 = *puVar10;
LAB_003f7d40:
          iVar8 = 0;
          if (0 < (int)uVar9) {
            iVar8 = -uVar9;
          }
        }
LAB_003f7d4d:
        iVar7 = uv__close_nocheckstdio(iVar7);
        if (iVar7 == 0) {
          iVar7 = iVar8;
        }
        if (iVar8 != 0) {
          iVar7 = iVar8;
        }
        if (local_2110 < 0) {
          if (iVar7 == 0) goto LAB_003f7f67;
        }
        else {
          iVar8 = uv__close_nocheckstdio(local_2110);
          if (iVar8 == 0) {
            iVar8 = iVar7;
          }
          if (iVar7 == 0) {
            iVar7 = iVar8;
          }
          if (iVar7 == 0) {
LAB_003f7f67:
            p_StackY_2120 = (_func_void_uv__work_ptr_int *)0x0;
            goto LAB_003f7e27;
          }
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)&pbuf,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&pbuf);
        }
        p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        *puVar10 = -iVar7;
      }
      goto LAB_003f7e27;
    case 0x1e:
      uVar9 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    default:
      goto switchD_003f7555_default;
    }
    p_StackY_2120 = (_func_void_uv__work_ptr_int *)(long)(int)uVar9;
LAB_003f7e27:
    if (p_StackY_2120 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_003f809c:
      w[-7].wq[1] = p_StackY_2120;
      if (p_StackY_2120 != (_func_void_uv__work_ptr_int *)0x0) {
        return;
      }
LAB_003f80a8:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
      return;
    }
LAB_003f7e31:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar10 != 4)) {
      w[-7].wq[1] = (void *)-(long)(int)*puVar10;
      return;
    }
  } while( true );
LAB_003f7781:
  if (lVar22 - lVar15 != 0 && lVar15 <= lVar22) {
LAB_003f77a0:
    do {
      sVar12 = write(iVar7,(void *)((long)pbuf.__glibc_reserved + lVar15 + -0x78),lVar22 - lVar15);
      if (sVar12 != -1) goto LAB_003f7808;
      if (*puVar10 != 4) {
        if (*puVar10 == 0xb) {
          pfd.events = 4;
          pfd.revents = 0;
          pfd.fd = iVar7;
          while (iVar5 = poll((pollfd *)&pfd,1,-1), iVar5 == -1) {
            if (*puVar10 != 4) goto LAB_003f7fb9;
          }
          if ((pfd._4_4_ & 0xfffb0000) == 0) goto LAB_003f77a0;
LAB_003f7fb9:
          *puVar10 = 5;
        }
        p_StackY_2120 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        goto LAB_003f7e27;
      }
    } while( true );
  }
  local_2108 = local_2108 + lVar22;
  p_StackY_2120 = p_StackY_2120 + lVar22;
  goto LAB_003f76e0;
LAB_003f7808:
  lVar15 = lVar15 + sVar12;
  goto LAB_003f7781;
LAB_003f7a8a:
  if (p_StackY_2120 == (_func_void_uv__work_ptr_int *)0x0) {
    p_StackY_2120 = (_func_void_uv__work_ptr_int *)0x0;
LAB_003f801c:
    if (p_Var20 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var20 = p_StackY_2120;
    }
    goto LAB_003f8023;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_StackY_2120;
  }
  p_Var11 = w[-1].work;
  pcVar18 = p_Var11 + 8;
  uVar17 = 0;
  for (p_Var19 = p_StackY_2120; p_Var19 != (_func_void_uv__work_ptr_int *)0x0;
      p_Var19 = p_Var19 + -(long)p_Var3) {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar18;
    if (p_Var19 <= p_Var3 && (long)p_Var3 - (long)p_Var19 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar18 + -8) = p_Var19 + *(ulong *)(pcVar18 + -8);
      *(long *)pcVar18 = (long)p_Var3 - (long)p_Var19;
      break;
    }
    uVar17 = uVar17 + 1;
    pcVar18 = pcVar18 + 0x10;
  }
  *(uint *)((long)w[-2].wq + 0xc) = uVar17;
  w[-1].work = p_Var11 + (ulong)uVar17 * 0x10;
  uVar9 = uVar9 - uVar17;
  p_Var20 = p_Var20 + (long)p_StackY_2120;
  goto LAB_003f79e0;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}